

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartCDATA(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  undefined8 *data;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    return -1;
  }
  lk._0_4_ = 0;
  lk_00 = xmlListFront(writer->nodes);
  if ((lk_00 == (xmlLinkPtr)0x0) || (pvVar3 = xmlLinkGetData(lk_00), pvVar3 == (void *)0x0))
  goto LAB_0021a4a5;
  switch(*(undefined4 *)((long)pvVar3 + 8)) {
  case 0:
  case 3:
  case 4:
  case 5:
    goto LAB_0021a4a5;
  case 2:
    lk._0_4_ = xmlTextWriterEndAttribute(writer);
    if ((int)lk < 0) {
      return -1;
    }
  case 1:
    iVar2 = xmlTextWriterOutputNSDecl(writer);
    if (iVar2 < 0) {
      writer_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlOutputBufferWriteString(writer->out,">");
      if (iVar1 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        lk._0_4_ = iVar1 + iVar2 + (int)lk;
        *(undefined4 *)((long)pvVar3 + 8) = 3;
LAB_0021a4a5:
        data = (undefined8 *)(*xmlMalloc)(0x10);
        if (data == (undefined8 *)0x0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartCDATA : out of memory!\n");
          writer_local._4_4_ = -1;
        }
        else {
          *data = 0;
          *(undefined4 *)(data + 1) = 6;
          xmlListPushFront(writer->nodes,data);
          iVar2 = xmlOutputBufferWriteString(writer->out,"<![CDATA[");
          if (iVar2 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            writer_local._4_4_ = iVar2 + (int)lk;
          }
        }
      }
    }
    break;
  case 6:
    xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterStartCDATA : CDATA not allowed in this context!\n");
    writer_local._4_4_ = -1;
    break;
  default:
    writer_local._4_4_ = -1;
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartCDATA(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            switch (p->state) {
                case XML_TEXTWRITER_NONE:
		case XML_TEXTWRITER_TEXT:
                case XML_TEXTWRITER_PI:
                case XML_TEXTWRITER_PI_TEXT:
                    break;
                case XML_TEXTWRITER_ATTRIBUTE:
                    count = xmlTextWriterEndAttribute(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    /* fallthrough */
                case XML_TEXTWRITER_NAME:
                    /* Output namespace declarations */
                    count = xmlTextWriterOutputNSDecl(writer);
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, ">");
                    if (count < 0)
                        return -1;
                    sum += count;
                    p->state = XML_TEXTWRITER_TEXT;
                    break;
                case XML_TEXTWRITER_CDATA:
                    xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                                    "xmlTextWriterStartCDATA : CDATA not allowed in this context!\n");
                    return -1;
                default:
                    return -1;
            }
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartCDATA : out of memory!\n");
        return -1;
    }

    p->name = NULL;
    p->state = XML_TEXTWRITER_CDATA;

    xmlListPushFront(writer->nodes, p);

    count = xmlOutputBufferWriteString(writer->out, "<![CDATA[");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}